

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

void ON_Sort(sort_algorithm method,uint *index,void *data,size_t count,size_t sizeof_element,
            _func_int_void_ptr_void_ptr_void_ptr *compar,void *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint local_7c;
  uint isizeof_element;
  uint icount;
  uint tmpi;
  uint k;
  uint j;
  uint i;
  void *tmp;
  uint *idx;
  tagON_SORT_CONTEXT context;
  _func_int_void_ptr_void_ptr_void_ptr *compar_local;
  size_t sizeof_element_local;
  size_t count_local;
  void *data_local;
  uint *index_local;
  sort_algorithm method_local;
  
  if (count == 0) {
    return;
  }
  if (index == (uint *)0x0) {
    return;
  }
  if (sizeof_element == 0) {
    return;
  }
  if (count == 1) {
    *index = 0;
    return;
  }
  uVar2 = (uint)count;
  k = 0;
  local_7c = uVar2;
  tmp = index;
  while (local_7c != 0) {
    *(uint *)tmp = k;
    k = (uint)sizeof_element + k;
    local_7c = local_7c - 1;
    tmp = (void *)((long)tmp + 4);
  }
  context.compar3 = compar;
  memset(&idx,0,0x20);
  idx = (uint *)p;
  context.compar2 = (_func_int_void_ptr_void_ptr *)context.compar3;
  tmp = index;
  context.users_context = data;
  if (method != quick_sort) {
    icount = uVar2 >> 1;
    local_7c = uVar2 - 1;
    do {
      if (icount == 0) {
        isizeof_element = index[local_7c];
        index[local_7c] = *index;
        local_7c = local_7c - 1;
        if (local_7c == 0) goto code_r0x006eff5f;
      }
      else {
        icount = icount - 1;
        isizeof_element = index[icount];
      }
      _j = (void *)((long)context.users_context + (ulong)isizeof_element);
      k = icount;
      uVar1 = icount * 2;
      while (tmpi = uVar1 + 1, tmpi <= local_7c) {
        if ((tmpi < local_7c) &&
           (iVar3 = (*context.compar2)((void *)((long)context.users_context + (ulong)index[tmpi]),
                                       (void *)((long)context.users_context +
                                               (ulong)index[uVar1 + 2])), iVar3 < 0)) {
          tmpi = uVar1 + 2;
        }
        iVar3 = (*context.compar2)(_j,(void *)((long)context.users_context + (ulong)index[tmpi]));
        uVar1 = local_7c;
        if (iVar3 < 0) {
          index[k] = index[tmpi];
          k = tmpi;
          uVar1 = tmpi * 2;
        }
      }
      index[k] = isizeof_element;
    } while( true );
  }
  ON_qsort(index,count,4,qicompar3,&idx);
  k = uVar2;
LAB_006f0047:
  while (k != 0) {
    *(uint *)tmp = *tmp / (uint)sizeof_element;
    tmp = (void *)((long)tmp + 4);
    k = k - 1;
  }
  return;
code_r0x006eff5f:
  *index = isizeof_element;
  k = uVar2;
  goto LAB_006f0047;
}

Assistant:

void
ON_Sort( ON::sort_algorithm method, 
  unsigned int* index, 
  const void* data, 
  size_t count, 
  size_t sizeof_element, 
  int (*compar)(const void*,const void*,void*),
  void* p
  )
{
  tagON_SORT_CONTEXT context;
  unsigned int* idx;
  const void* tmp;
  unsigned int i, j, k, tmpi, icount, isizeof_element;
  
  if (count < 1 || 0 == index || sizeof_element <= 0) 
  {
    return;
  }
  if (1 == count) 
  {
    index[0]=0;
    return;
  }

  isizeof_element = (unsigned int)sizeof_element; // (int) converts 64 bit size_t
  icount = (unsigned int)count;
  idx = index;
  
  for ( i = 0; icount--; i += isizeof_element )
  {
    *idx++ = i;
  }

  memset(&context,0,sizeof(context));
  context.users_context = p;
  context.qdata = (const unsigned char*)data;
  context.compar3 = compar;
  idx = index;
  if ( ON::sort_algorithm::quick_sort == method )
  {
    ON_qsort(idx,count,sizeof(idx[0]),qicompar3,&context);
  }
  else
  {
    // heap sort
    icount = (unsigned int)count;

    k = icount >> 1;
    icount--;
    for (;;) 
    {
      if (k) 
      {
        tmpi = idx[--k];
        tmp  = context.qdata + tmpi;
      }
      else 
      {
        tmpi = idx[icount];
        tmp  = context.qdata + tmpi;
        idx[icount] = idx[0];
        if (!(--icount)) 
        {
          idx[0] = tmpi;
          break;
        }
      }
      i = k;
      j = (k<<1) + 1;
      while (j <= icount) 
      {
        if (j < icount && context.compar3(context.qdata + idx[j], context.qdata + idx[j+1], context.users_context) < 0) 
        {
          j++;
        }
        if (context.compar3(tmp,context.qdata + idx[j], context.users_context) < 0) 
        {
          idx[i] = idx[j];
          i = j;
          j = (j<<1) + 1;
        } 
        else 
        {
          j = icount + 1;
        }
      }
      idx[i] = tmpi;
    }
  }

  for (i = (unsigned int)count; i--; idx++ )
  {
    *idx /= isizeof_element;
  }
}